

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O3

ACT_TYPE __thiscall
despot::MeanMDPPolicy::Action
          (MeanMDPPolicy *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  ACT_TYPE AVar1;
  pointer ppSVar2;
  pointer ppSVar3;
  State *pSVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint num_mdp_actions;
  ChainState *this_00;
  long lVar8;
  long lVar9;
  int state2;
  long lVar10;
  long lVar11;
  int state2_1;
  long lVar12;
  int state1;
  long lVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  
  num_mdp_actions = (**(code **)(*(long *)this->chain_model_ + 0x28))();
  this_00 = (ChainState *)
            (**(code **)(*(long *)this->chain_model_ + 0xa8))
                      (0x3ff0000000000000,this->chain_model_,0xffffffff);
  ChainState::Init(this_00,5,num_mdp_actions);
  ppSVar2 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar3 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)ppSVar3 - (long)ppSVar2;
  lVar9 = lVar8 >> 3;
  if (ppSVar3 != ppSVar2) {
    lVar11 = 0;
    do {
      pSVar4 = ppSVar2[lVar11];
      lVar13 = 0;
      do {
        if (0 < (int)num_mdp_actions) {
          lVar12 = *(long *)&(this_00->mdp_transitions_).
                             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar13].
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data;
          lVar5 = *(long *)(*(long *)(pSVar4 + 0x20) + lVar13 * 0x18);
          uVar14 = 0;
          do {
            lVar6 = *(long *)(lVar12 + uVar14 * 0x18);
            lVar7 = *(long *)(lVar5 + uVar14 * 0x18);
            lVar10 = 0;
            do {
              *(double *)(lVar6 + lVar10 * 8) =
                   *(double *)(lVar6 + lVar10 * 8) + *(double *)(lVar7 + lVar10 * 8);
              lVar10 = lVar10 + 1;
            } while (lVar10 != 5);
            uVar14 = uVar14 + 1;
          } while (uVar14 != num_mdp_actions);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 5);
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar9 + (ulong)(lVar9 == 0));
  }
  auVar15._8_4_ = (int)(lVar8 >> 0x23);
  auVar15._0_8_ = lVar9;
  auVar15._12_4_ = 0x45300000;
  lVar8 = 0;
  do {
    if (0 < (int)num_mdp_actions) {
      lVar11 = *(long *)&(this_00->mdp_transitions_).
                         super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar8].
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data;
      uVar14 = 0;
      do {
        lVar13 = *(long *)(lVar11 + uVar14 * 0x18);
        lVar12 = 0;
        do {
          *(double *)(lVar13 + lVar12 * 8) =
               *(double *)(lVar13 + lVar12 * 8) /
               ((auVar15._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
          lVar12 = lVar12 + 1;
        } while (lVar12 != 5);
        uVar14 = uVar14 + 1;
      } while (uVar14 != num_mdp_actions);
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 5);
  Chain::ComputeOptimalValue(this->chain_model_,this_00);
  AVar1 = *(ACT_TYPE *)
           ((this_00->policy).
            super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
            super__Vector_impl_data._M_start +
           (long)*(int *)(*(particles->
                           super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                           _M_impl.super__Vector_impl_data._M_start + 0x38) * 0x10);
  (**(code **)(*(long *)this->chain_model_ + 0xb8))(this->chain_model_,this_00);
  return AVar1;
}

Assistant:

ACT_TYPE Action(const vector<State*>& particles, RandomStreams& streams,
		History& history) const {
		int num_mdp_states = chain_model_->NUM_MDP_STATES, num_mdp_actions =
			chain_model_->NumActions();

		ChainState* mean = static_cast<ChainState*>(chain_model_->Allocate(-1,
			1.0));
		mean->Init(num_mdp_states, num_mdp_actions);

		// mean->mdp_state = cur_state_;
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			ChainState* state = static_cast<ChainState*>(particle);
			for (int state1 = 0; state1 < num_mdp_states; state1++) {
				for (ACT_TYPE action = 0; action < num_mdp_actions; action++) {
					for (int state2 = 0; state2 < num_mdp_states; state2++) {
						double prob1 = mean->GetTransition(state1, action,
							state2);
						double prob2 = state->GetTransition(state1, action,
							state2);
						mean->SetTransition(state1, action, state2,
							prob1 + prob2);
					}
				}
			}
		}

		for (int state1 = 0; state1 < num_mdp_states; state1++) {
			for (ACT_TYPE action = 0; action < num_mdp_actions; action++) {
				for (int state2 = 0; state2 < num_mdp_states; state2++) {
					double prob = mean->GetTransition(state1, action, state2);
					mean->SetTransition(state1, action, state2,
						prob / particles.size());
				}
			}
		}

		chain_model_->ComputeOptimalValue(*mean);

		ACT_TYPE action =
			mean->policy[static_cast<ChainState*>(particles[0])->mdp_state].action;
		chain_model_->Free(mean);
		return action;
	}